

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

IGUIElement * __thiscall
irr::gui::IGUIElement::getElementFromPoint(IGUIElement *this,vector2d<int> *point)

{
  IGUIElement *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference ppIVar5;
  undefined4 extraout_var;
  undefined8 in_RSI;
  IGUIElement *in_RDI;
  reverse_iterator ie;
  reverse_iterator it;
  IGUIElement *target;
  reverse_iterator<std::_List_iterator<irr::gui::IGUIElement_*>_> *in_stack_ffffffffffffffd0;
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *in_stack_ffffffffffffffd8
  ;
  IGUIElement *local_20;
  
  uVar3 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0xd])();
  if ((uVar3 & 1) != 0) {
    ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::rbegin
              (in_stack_ffffffffffffffd8);
    ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::rend
              (in_stack_ffffffffffffffd8);
    while (bVar2 = ::std::operator!=(in_stack_ffffffffffffffd0,
                                     (reverse_iterator<std::_List_iterator<irr::gui::IGUIElement_*>_>
                                      *)in_RDI), bVar2) {
      ppIVar5 = ::std::reverse_iterator<std::_List_iterator<irr::gui::IGUIElement_*>_>::operator*
                          (in_stack_ffffffffffffffd0);
      iVar4 = (*((*ppIVar5)->super_IEventReceiver)._vptr_IEventReceiver[4])(*ppIVar5,in_RSI);
      if ((IGUIElement *)CONCAT44(extraout_var,iVar4) != (IGUIElement *)0x0) {
        return (IGUIElement *)CONCAT44(extraout_var,iVar4);
      }
      ::std::reverse_iterator<std::_List_iterator<irr::gui::IGUIElement_*>_>::operator++
                (in_stack_ffffffffffffffd0);
    }
  }
  local_20 = (IGUIElement *)0x0;
  uVar3 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0xd])();
  pIVar1 = local_20;
  if (((uVar3 & 1) != 0) &&
     (uVar3 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[5])(in_RDI,in_RSI),
     pIVar1 = in_RDI, (uVar3 & 1) == 0)) {
    pIVar1 = local_20;
  }
  local_20 = pIVar1;
  return local_20;
}

Assistant:

virtual IGUIElement *getElementFromPoint(const core::position2d<s32> &point)
	{
		IGUIElement *target = 0;

		if (isVisible()) {
			// we have to search from back to front, because later children
			// might be drawn over the top of earlier ones.
			auto it = Children.rbegin();
			auto ie = Children.rend();
			while (it != ie) {
				target = (*it)->getElementFromPoint(point);
				if (target)
					return target;

				++it;
			}
		}

		if (isVisible() && isPointInside(point))
			target = this;

		return target;
	}